

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parallel_hash_set_test.cc
# Opt level: O1

void __thiscall
phmap::priv::anon_unknown_5::ParallelFlatHashSet_LazyEmplaceL_Test::TestBody
          (ParallelFlatHashSet_LazyEmplaceL_Test *this)

{
  slot_type *psVar1;
  key_arg<phmap::priv::(anonymous_namespace)::Entry> *mutexlock;
  UniqueLock *mutexlock_00;
  char *message;
  initializer_list<phmap::priv::(anonymous_namespace)::Entry> iVar2;
  AssertionResult gtest_ar;
  tuple<phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<phmap::priv::(anonymous_namespace)::Entry>,_phmap::Hash<phmap::priv::(anonymous_namespace)::Entry>,_phmap::EqualTo<phmap::priv::(anonymous_namespace)::Entry>,_std::allocator<phmap::priv::(anonymous_namespace)::Entry>_>::Inner_*,_unsigned_long,_bool>
  res;
  Set m;
  allocator_type *in_stack_fffffffffffffc98;
  key_arg<phmap::priv::(anonymous_namespace)::Entry> local_360;
  Entry local_358;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_350;
  int local_344;
  iterator local_340;
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<phmap::priv::(anonymous_namespace)::Entry>,_phmap::Hash<phmap::priv::(anonymous_namespace)::Entry>,_phmap::EqualTo<phmap::priv::(anonymous_namespace)::Entry>,_std::allocator<phmap::priv::(anonymous_namespace)::Entry>_>
  local_310;
  
  local_340.inner_ = (Inner *)0x700000001;
  local_340.inner_end_ = (Inner *)0x900000002;
  mutexlock = &local_360;
  iVar2._M_len = 2;
  iVar2._M_array = (iterator)&local_340;
  parallel_flat_hash_set<phmap::priv::(anonymous_namespace)::Entry,_phmap::Hash<phmap::priv::(anonymous_namespace)::Entry>,_phmap::EqualTo<phmap::priv::(anonymous_namespace)::Entry>,_std::allocator<phmap::priv::(anonymous_namespace)::Entry>,_4UL,_phmap::NullMutex>
  ::parallel_hash_set((parallel_flat_hash_set<phmap::priv::(anonymous_namespace)::Entry,_phmap::Hash<phmap::priv::(anonymous_namespace)::Entry>,_phmap::EqualTo<phmap::priv::(anonymous_namespace)::Entry>,_std::allocator<phmap::priv::(anonymous_namespace)::Entry>,_4UL,_phmap::NullMutex>
                       *)&local_310,iVar2,(size_t)&local_358,(hasher *)mutexlock,
                      (key_equal *)&local_344,in_stack_fffffffffffffc98);
  local_358.key = 5;
  local_358.value = 0;
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<phmap::priv::(anonymous_namespace)::Entry>,_phmap::Hash<phmap::priv::(anonymous_namespace)::Entry>,_phmap::EqualTo<phmap::priv::(anonymous_namespace)::Entry>,_std::allocator<phmap::priv::(anonymous_namespace)::Entry>_>
  ::find_or_prepare_insert_with_hash<phmap::priv::(anonymous_namespace)::Entry>
            ((tuple<phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<phmap::priv::(anonymous_namespace)::Entry>,_phmap::Hash<phmap::priv::(anonymous_namespace)::Entry>,_phmap::EqualTo<phmap::priv::(anonymous_namespace)::Entry>,_std::allocator<phmap::priv::(anonymous_namespace)::Entry>_>::Inner_*,_unsigned_long,_bool>
              *)&local_340,&local_310,0xf4e2d492cc048d2f,&local_358,(UniqueLock *)mutexlock);
  if ((char)local_340.inner_ == '\x01') {
    if (*(slot_type **)((long)local_340.it_.ctrl_ + 8) == (slot_type *)0x0) goto LAB_00125804;
    psVar1 = *(slot_type **)((long)local_340.it_.ctrl_ + 8) + (long)local_340.inner_end_;
    psVar1->key = 5;
    psVar1->value = 0xd;
    raw_hash_set<phmap::priv::FlatHashSetPolicy<phmap::priv::(anonymous_namespace)::Entry>,_phmap::Hash<phmap::priv::(anonymous_namespace)::Entry>,_phmap::EqualTo<phmap::priv::(anonymous_namespace)::Entry>,_std::allocator<phmap::priv::(anonymous_namespace)::Entry>_>
    ::set_ctrl((raw_hash_set<phmap::priv::FlatHashSetPolicy<phmap::priv::(anonymous_namespace)::Entry>,_phmap::Hash<phmap::priv::(anonymous_namespace)::Entry>,_phmap::EqualTo<phmap::priv::(anonymous_namespace)::Entry>,_std::allocator<phmap::priv::(anonymous_namespace)::Entry>_>
                *)local_340.it_.ctrl_,(size_t)local_340.inner_end_,'/');
  }
  else {
    (*(slot_type **)((long)local_340.it_.ctrl_ + 8))[(long)local_340.inner_end_].value = 6;
  }
  local_360.key = 5;
  local_360.value = 0;
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<phmap::priv::(anonymous_namespace)::Entry>,_phmap::Hash<phmap::priv::(anonymous_namespace)::Entry>,_phmap::EqualTo<phmap::priv::(anonymous_namespace)::Entry>,_std::allocator<phmap::priv::(anonymous_namespace)::Entry>_>
  ::find<phmap::priv::(anonymous_namespace)::Entry>(&local_340,&local_310,&local_360);
  mutexlock_00 = (UniqueLock *)&local_344;
  local_344 = 0xd;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&local_358,"m.find(Entry{5})->value","13",
             &(local_340.it_.field_1.slot_)->value,(int *)mutexlock_00);
  if ((char)local_358.key == '\0') {
    testing::Message::Message((Message *)&local_340);
    if (local_350 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      mutexlock_00 = (UniqueLock *)0x2310ff;
    }
    else {
      mutexlock_00 = (UniqueLock *)(local_350->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_360,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/parallel_hash_set_test.cc"
               ,0x4f,(char *)mutexlock_00);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_360,(Message *)&local_340);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_360);
    if (local_340.inner_ != (Inner *)0x0) {
      (**(code **)(((local_340.inner_)->set_).ctrl_ + 8))();
    }
  }
  if (local_350 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_350,local_350);
  }
  local_358.key = 5;
  local_358.value = 0;
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<phmap::priv::(anonymous_namespace)::Entry>,_phmap::Hash<phmap::priv::(anonymous_namespace)::Entry>,_phmap::EqualTo<phmap::priv::(anonymous_namespace)::Entry>,_std::allocator<phmap::priv::(anonymous_namespace)::Entry>_>
  ::find_or_prepare_insert_with_hash<phmap::priv::(anonymous_namespace)::Entry>
            ((tuple<phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<phmap::priv::(anonymous_namespace)::Entry>,_phmap::Hash<phmap::priv::(anonymous_namespace)::Entry>,_phmap::EqualTo<phmap::priv::(anonymous_namespace)::Entry>,_std::allocator<phmap::priv::(anonymous_namespace)::Entry>_>::Inner_*,_unsigned_long,_bool>
              *)&local_340,&local_310,0xf4e2d492cc048d2f,&local_358,mutexlock_00);
  if ((char)local_340.inner_ == '\x01') {
    if (*(slot_type **)((long)local_340.it_.ctrl_ + 8) == (slot_type *)0x0) {
LAB_00125804:
      __assert_fail("*slot_",
                    "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap.h"
                    ,0x5ee,
                    "void phmap::priv::raw_hash_set<phmap::priv::FlatHashSetPolicy<phmap::priv::(anonymous namespace)::Entry>, phmap::Hash<phmap::priv::(anonymous namespace)::Entry>, phmap::EqualTo<phmap::priv::(anonymous namespace)::Entry>, std::allocator<phmap::priv::(anonymous namespace)::Entry>>::constructor::operator()(Args &&...) const [Policy = phmap::priv::FlatHashSetPolicy<phmap::priv::(anonymous namespace)::Entry>, Hash = phmap::Hash<phmap::priv::(anonymous namespace)::Entry>, Eq = phmap::EqualTo<phmap::priv::(anonymous namespace)::Entry>, Alloc = std::allocator<phmap::priv::(anonymous namespace)::Entry>, Args = <int, int>]"
                   );
    }
    psVar1 = *(slot_type **)((long)local_340.it_.ctrl_ + 8) + (long)local_340.inner_end_;
    psVar1->key = 5;
    psVar1->value = 0xd;
    raw_hash_set<phmap::priv::FlatHashSetPolicy<phmap::priv::(anonymous_namespace)::Entry>,_phmap::Hash<phmap::priv::(anonymous_namespace)::Entry>,_phmap::EqualTo<phmap::priv::(anonymous_namespace)::Entry>,_std::allocator<phmap::priv::(anonymous_namespace)::Entry>_>
    ::set_ctrl((raw_hash_set<phmap::priv::FlatHashSetPolicy<phmap::priv::(anonymous_namespace)::Entry>,_phmap::Hash<phmap::priv::(anonymous_namespace)::Entry>,_phmap::EqualTo<phmap::priv::(anonymous_namespace)::Entry>,_std::allocator<phmap::priv::(anonymous_namespace)::Entry>_>
                *)local_340.it_.ctrl_,(size_t)local_340.inner_end_,'/');
  }
  else {
    (*(slot_type **)((long)local_340.it_.ctrl_ + 8))[(long)local_340.inner_end_].value = 6;
  }
  local_360.key = 5;
  local_360.value = 0;
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<phmap::priv::(anonymous_namespace)::Entry>,_phmap::Hash<phmap::priv::(anonymous_namespace)::Entry>,_phmap::EqualTo<phmap::priv::(anonymous_namespace)::Entry>,_std::allocator<phmap::priv::(anonymous_namespace)::Entry>_>
  ::find<phmap::priv::(anonymous_namespace)::Entry>(&local_340,&local_310,&local_360);
  local_344 = 6;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&local_358,"m.find(Entry{5})->value","6",
             &(local_340.it_.field_1.slot_)->value,&local_344);
  if ((char)local_358.key == '\0') {
    testing::Message::Message((Message *)&local_340);
    if (local_350 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = (local_350->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_360,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/parallel_hash_set_test.cc"
               ,0x55,message);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_360,(Message *)&local_340);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_360);
    if (local_340.inner_ != (Inner *)0x0) {
      (**(code **)(((local_340.inner_)->set_).ctrl_ + 8))();
    }
  }
  if (local_350 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_350,local_350);
  }
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<phmap::priv::(anonymous_namespace)::Entry>,_phmap::Hash<phmap::priv::(anonymous_namespace)::Entry>,_phmap::EqualTo<phmap::priv::(anonymous_namespace)::Entry>,_std::allocator<phmap::priv::(anonymous_namespace)::Entry>_>
  ::~parallel_hash_set(&local_310);
  return;
}

Assistant:

Entry(int k, int v=0) : key(k), value(v) {}